

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

Aig_Man_t * Ivy_FraigExtractCone(Ivy_Man_t *p,Ivy_Obj_t *pObj1,Ivy_Obj_t *pObj2,Vec_Int_t *vLeaves)

{
  undefined1 *puVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *vNodes;
  int *piVar4;
  Aig_Man_t *p_00;
  Ivy_Obj_t *pIVar5;
  Ivy_Obj_t *pIVar6;
  Ivy_Obj_t *p1;
  Aig_Obj_t *pAVar7;
  int iVar8;
  
  vNodes = (Vec_Int_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  piVar4 = (int *)malloc(400);
  vNodes->pArray = piVar4;
  puVar1 = &p->pConst1->field_0x8;
  *(uint *)puVar1 = *(uint *)puVar1 | 0x20;
  Ivy_FraigExtractCone_rec(p,pObj1,vLeaves,vNodes);
  Ivy_FraigExtractCone_rec(p,pObj2,vLeaves,vNodes);
  puVar1 = &p->pConst1->field_0x8;
  *(uint *)puVar1 = *(uint *)puVar1 & 0xffffffdf;
  p_00 = Aig_ManStart(1000);
  p->pConst1->pEquiv = (Ivy_Obj_t *)p_00->pConst1;
  for (iVar8 = 0; iVar8 < vLeaves->nSize; iVar8 = iVar8 + 1) {
    iVar3 = Vec_IntEntry(vLeaves,iVar8);
    pIVar5 = Ivy_ManObj(p,iVar3);
    if (pIVar5 == (Ivy_Obj_t *)0x0) break;
    pIVar6 = (Ivy_Obj_t *)Aig_ObjCreateCi(p_00);
    pIVar5->pEquiv = pIVar6;
    pIVar5->field_0x8 = pIVar5->field_0x8 & 0xdf;
  }
  iVar8 = 0;
  while (iVar8 < vNodes->nSize) {
    iVar3 = Vec_IntEntry(vNodes,iVar8);
    pIVar5 = Ivy_ManObj(p,iVar3);
    if (pIVar5 == (Ivy_Obj_t *)0x0) break;
    pIVar6 = Ivy_ObjChild0Equiv(pIVar5);
    p1 = Ivy_ObjChild1Equiv(pIVar5);
    pIVar6 = (Ivy_Obj_t *)Aig_And(p_00,(Aig_Obj_t *)pIVar6,(Aig_Obj_t *)p1);
    pIVar5->pEquiv = pIVar6;
    uVar2 = *(uint *)&pIVar5->field_0x8;
    *(uint *)&pIVar5->field_0x8 = uVar2 & 0xffffffdf;
    iVar8 = iVar8 + 1;
    if (((uVar2 >> 7 ^ *(uint *)&pIVar6->pFanin1 >> 3) & 1) != 0) {
      __assert_fail("pMiter->fPhase == pObjIvy->fPhase",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                    ,0xb50,
                    "Aig_Man_t *Ivy_FraigExtractCone(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Vec_Int_t *)"
                   );
    }
  }
  pAVar7 = Aig_Exor(p_00,(Aig_Obj_t *)pObj1->pEquiv,(Aig_Obj_t *)pObj2->pEquiv);
  Aig_ObjCreateCo(p_00,(Aig_Obj_t *)
                       ((ulong)(((uint)pAVar7 ^
                                *(uint *)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18) >> 3) & 1) ^
                       (ulong)pAVar7));
  Aig_ManCleanup(p_00);
  free(vNodes->pArray);
  free(vNodes);
  return p_00;
}

Assistant:

Aig_Man_t * Ivy_FraigExtractCone( Ivy_Man_t * p, Ivy_Obj_t * pObj1, Ivy_Obj_t * pObj2, Vec_Int_t * vLeaves )
{
    Aig_Man_t * pMan;
    Aig_Obj_t * pMiter;
    Vec_Int_t * vNodes;
    Ivy_Obj_t * pObjIvy;
    int i;
    // collect nodes
    vNodes  = Vec_IntAlloc( 100 );
    Ivy_ManConst1(p)->fMarkB = 1;
    Ivy_FraigExtractCone_rec( p, pObj1, vLeaves, vNodes );
    Ivy_FraigExtractCone_rec( p, pObj2, vLeaves, vNodes );
    Ivy_ManConst1(p)->fMarkB = 0;
    // create new manager
    pMan = Aig_ManStart( 1000 );
    Ivy_ManConst1(p)->pEquiv = (Ivy_Obj_t *)Aig_ManConst1(pMan);
    Ivy_ManForEachNodeVec( p, vLeaves, pObjIvy, i )
    {
        pObjIvy->pEquiv = (Ivy_Obj_t *)Aig_ObjCreateCi( pMan );
        pObjIvy->fMarkB = 0;
    }
    // duplicate internal nodes
    Ivy_ManForEachNodeVec( p, vNodes, pObjIvy, i )
    {

        pObjIvy->pEquiv = (Ivy_Obj_t *)Aig_And( pMan, (Aig_Obj_t *)Ivy_ObjChild0Equiv(pObjIvy), (Aig_Obj_t *)Ivy_ObjChild1Equiv(pObjIvy) );
        pObjIvy->fMarkB = 0;

        pMiter = (Aig_Obj_t *)pObjIvy->pEquiv;
        assert( pMiter->fPhase == pObjIvy->fPhase );
    }
    // create the PO
    pMiter = Aig_Exor( pMan, (Aig_Obj_t *)pObj1->pEquiv, (Aig_Obj_t *)pObj2->pEquiv );
    pMiter = Aig_NotCond( pMiter, Aig_Regular(pMiter)->fPhase ^ Aig_IsComplement(pMiter) );

/*
printf( "Polarity = %d\n", pMiter->fPhase );
    if ( Ivy_ObjIsConst1(pObj1) || Ivy_ObjIsConst1(pObj2) )
    {
        pMiter = Aig_NotCond( pMiter, 1 );
printf( "***************\n" );
    }
*/
    pMiter = Aig_ObjCreateCo( pMan, pMiter );
//printf( "Polarity = %d\n", pMiter->fPhase );
    Aig_ManCleanup( pMan );
    Vec_IntFree( vNodes );
    return pMan;
}